

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O3

void NULLC::CollectUnmarked(void)

{
  if (bigBlocks._24_8_ != 0) {
    Tree<NULLC::Range>::for_each
              ((Tree<NULLC::Range> *)bigBlocks,(node_type *)bigBlocks._24_8_,CollectUnmarkedBlock);
  }
  ObjectBlockPool<8,_8192>::CollectUnmarked((ObjectBlockPool<8,_8192> *)pool8);
  ObjectBlockPool<16,_4096>::CollectUnmarked((ObjectBlockPool<16,_4096> *)pool16);
  ObjectBlockPool<32,_2048>::CollectUnmarked((ObjectBlockPool<32,_2048> *)pool32);
  ObjectBlockPool<64,_1024>::CollectUnmarked((ObjectBlockPool<64,_1024> *)pool64);
  ObjectBlockPool<128,_512>::CollectUnmarked((ObjectBlockPool<128,_512> *)pool128);
  ObjectBlockPool<256,_256>::CollectUnmarked((ObjectBlockPool<256,_256> *)pool256);
  ObjectBlockPool<512,_128>::CollectUnmarked((ObjectBlockPool<512,_128> *)pool512);
  return;
}

Assistant:

void NULLC::CollectUnmarked()
{
	bigBlocks.for_each(CollectUnmarkedBlock);

	pool8.CollectUnmarked();
	pool16.CollectUnmarked();
	pool32.CollectUnmarked();
	pool64.CollectUnmarked();
	pool128.CollectUnmarked();
	pool256.CollectUnmarked();
	pool512.CollectUnmarked();
}